

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

void __thiscall
CTPNStmProg::build_object_file(CTPNStmProg *this,CVmFile *object_fp,CTcMake *make_obj)

{
  int iVar1;
  CTPNStmProg *in_RDI;
  CVmFile *in_stack_00000018;
  CTcGenTarg *in_stack_00000020;
  
  iVar1 = gen_code_for_build(in_RDI);
  if (iVar1 == 0) {
    CTcGenTarg::write_to_object_file(in_stack_00000020,in_stack_00000018,(CTcMake *)this);
  }
  return;
}

Assistant:

void CTPNStmProg::build_object_file(class CVmFile *object_fp,
                                    class CTcMake *make_obj)
{
    /* generate code */
    if (gen_code_for_build())
        return;

    /*
     *   Finally, our task of constructing the program is complete.  All
     *   that remains is to write the image file.  Tell the code generator
     *   to begin the process.  
     */
    G_cg->write_to_object_file(object_fp, make_obj);
}